

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<bool,iutest::TestFlag::Fragment<8192>>
          (string *__return_storage_ptr__,internal *this,bool *value,Fragment<8192> *param_2)

{
  Fragment<8192> *param_1_local;
  bool *value_local;
  
  PrintToString<bool>(__return_storage_ptr__,(bool *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}